

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

QString * int2string(QString *__return_storage_ptr__,int num,int base,int ndigits,bool *oflow)

{
  QString *pQVar1;
  char buf [42];
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (QString *)(*(code *)(&DAT_006d70c0 + *(int *)(&DAT_006d70c0 + (ulong)(uint)base * 4)))()
  ;
  return pQVar1;
}

Assistant:

static QString int2string(int num, int base, int ndigits, bool *oflow)
{
    QString s;
    bool negative;
    if (num < 0) {
        negative = true;
        num      = -num;
    } else {
        negative = false;
    }
    switch(base) {
        case QLCDNumber::Hex:
            s = QString::asprintf("%*x", ndigits, num);
            break;
        case QLCDNumber::Dec:
            s = QString::asprintf("%*i", ndigits, num);
            break;
        case QLCDNumber::Oct:
            s = QString::asprintf("%*o", ndigits, num);
            break;
        case QLCDNumber::Bin:
            {
                char buf[42];
                char *p = &buf[41];
                uint n = num;
                int len = 0;
                *p = '\0';
                do {
                    *--p = (char)((n&1)+'0');
                    n >>= 1;
                    len++;
                } while (n != 0);
                len = ndigits - len;
                if (len > 0)
                    s += QString(len, u' ');
                s += QLatin1StringView(p);
            }
            break;
    }
    if (negative) {
        for (int i=0; i<(int)s.size(); i++) {
            if (s[i] != u' ') {
                if (i != 0) {
                    s[i-1] = u'-';
                } else {
                    s.insert(0, u'-');
                }
                break;
            }
        }
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}